

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractsocket.cpp
# Opt level: O0

bool __thiscall QAbstractSocket::waitForConnected(QAbstractSocket *this,int msecs)

{
  duration<long,_std::ratio<1L,_1L>_> remaining;
  byte bVar1;
  bool bVar2;
  SocketState SVar3;
  QAbstractSocketPrivate *this_00;
  ulong uVar4;
  int in_ESI;
  QString *in_RDI;
  long in_FS_OFFSET;
  bool wasPendingClose;
  QAbstractSocketPrivate *d;
  QDeadlineTimer timer;
  bool timedOut;
  QHostInfo info;
  QHostAddress temp;
  QDeadlineTimer deadline;
  undefined4 in_stack_ffffffffffffff08;
  SocketState in_stack_ffffffffffffff0c;
  QAbstractSocketPrivate *in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff18;
  undefined2 in_stack_ffffffffffffff1c;
  undefined1 in_stack_ffffffffffffff1e;
  undefined1 in_stack_ffffffffffffff1f;
  byte bVar5;
  QHostInfo *in_stack_ffffffffffffff20;
  undefined7 in_stack_ffffffffffffff30;
  QAbstractSocketPrivate *pQVar6;
  bool local_a9;
  qint64 local_78;
  undefined8 local_70;
  qint64 local_60;
  uint local_58;
  uint uStack_54;
  byte local_49 [9];
  undefined1 local_40 [24];
  undefined8 local_28;
  undefined8 local_20;
  QDeadlineTimer local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = d_func((QAbstractSocket *)0x2532c4);
  SVar3 = state((QAbstractSocket *)0x2532d3);
  if (SVar3 == ConnectedState) {
    local_a9 = true;
  }
  else {
    bVar1 = this_00->pendingClose & 1;
    this_00->pendingClose = false;
    local_18.t1 = -0x5555555555555556;
    local_18.t2 = 0xaaaaaaaa;
    local_18.type = 0xaaaaaaaa;
    QDeadlineTimer::QDeadlineTimer(&local_18,(long)in_ESI,CoarseTimer);
    if (this_00->state == HostLookupState) {
      QHostInfo::abortHostLookup(0);
      this_00->hostLookupId = -1;
      local_20 = 0xaaaaaaaaaaaaaaaa;
      QHostAddress::QHostAddress((QHostAddress *)in_stack_ffffffffffffff10);
      bVar2 = QHostAddress::setAddress
                        ((QHostAddress *)in_stack_ffffffffffffff10,
                         (QString *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
      if (bVar2) {
        local_28 = 0xaaaaaaaaaaaaaaaa;
        QHostInfo::QHostInfo
                  (in_stack_ffffffffffffff20,
                   CONCAT13(in_stack_ffffffffffffff1f,
                            CONCAT12(in_stack_ffffffffffffff1e,in_stack_ffffffffffffff1c)));
        memset(local_40,0,0x18);
        QList<QHostAddress>::QList((QList<QHostAddress> *)0x2533e5);
        QList<QHostAddress>::operator<<
                  ((QList<QHostAddress> *)in_stack_ffffffffffffff10,
                   (parameter_type)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
        QHostInfo::setAddresses
                  ((QHostInfo *)in_stack_ffffffffffffff10,
                   (QList<QHostAddress> *)
                   CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
        QList<QHostAddress>::~QList((QList<QHostAddress> *)0x253417);
        QAbstractSocketPrivate::_q_startConnecting
                  (this_00,(QHostInfo *)CONCAT17(bVar1,in_stack_ffffffffffffff30));
        QHostInfo::~QHostInfo((QHostInfo *)in_stack_ffffffffffffff10);
      }
      else {
        QHostInfo::fromName(in_RDI);
        QAbstractSocketPrivate::_q_startConnecting
                  (this_00,(QHostInfo *)CONCAT17(bVar1,in_stack_ffffffffffffff30));
        QHostInfo::~QHostInfo((QHostInfo *)in_stack_ffffffffffffff10);
      }
      QHostAddress::~QHostAddress((QHostAddress *)0x253487);
    }
    SVar3 = state((QAbstractSocket *)0x253491);
    if (SVar3 == UnconnectedState) {
      local_a9 = false;
    }
    else {
      local_49[0] = 1;
      while( true ) {
        SVar3 = state((QAbstractSocket *)0x2534b2);
        bVar5 = 0;
        if (SVar3 == ConnectingState) {
          bVar5 = QDeadlineTimer::hasExpired();
          bVar5 = bVar5 ^ 0xff;
        }
        if ((bVar5 & 1) == 0) break;
        local_60 = local_18.t1;
        local_58 = local_18.t2;
        uStack_54 = local_18.type;
        bVar2 = QDeadlineTimer::isForever((QDeadlineTimer *)in_stack_ffffffffffffff10);
        in_stack_ffffffffffffff1e = false;
        if (!bVar2) {
          QDeadlineTimer::remainingTimeAsDuration
                    ((QDeadlineTimer *)
                     CONCAT17(bVar5,(uint7)CONCAT24(in_stack_ffffffffffffff1c,
                                                    in_stack_ffffffffffffff18)));
          in_stack_ffffffffffffff1e =
               std::chrono::operator>
                         ((duration<long,_std::ratio<1L,_1000000000L>_> *)in_stack_ffffffffffffff10,
                          (duration<long,_std::ratio<1L,_1L>_> *)
                          CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
        }
        if ((bool)in_stack_ffffffffffffff1e != false) {
          remaining.__r._4_2_ = in_stack_ffffffffffffff1c;
          remaining.__r._0_4_ = in_stack_ffffffffffffff18;
          remaining.__r._6_1_ = (bool)in_stack_ffffffffffffff1e;
          remaining.__r._7_1_ = bVar5;
          QDeadlineTimer::QDeadlineTimer<long,std::ratio<1l,1l>>
                    ((QDeadlineTimer *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08)
                     ,remaining,PreciseTimer);
          local_60 = local_78;
          _local_58 = local_70;
        }
        local_49[0] = 0;
        if (((this_00->socketEngine == (QAbstractSocketEngine *)0x0) ||
            (uVar4 = (**(code **)(*(long *)this_00->socketEngine + 0x128))
                               (this_00->socketEngine,local_60,_local_58,local_49), (uVar4 & 1) == 0
            )) || ((local_49[0] & 1) != 0)) {
          QAbstractSocketPrivate::_q_connectToNextAddress
                    ((QAbstractSocketPrivate *)CONCAT17(bVar1,in_stack_ffffffffffffff30));
        }
        else {
          QAbstractSocketPrivate::_q_testConnection(in_stack_ffffffffffffff10);
        }
      }
      if ((((local_49[0] & 1) != 0) &&
          (SVar3 = state((QAbstractSocket *)0x253648), SVar3 != ConnectedState)) ||
         (SVar3 = state((QAbstractSocket *)0x253657), SVar3 == ConnectingState)) {
        pQVar6 = this_00;
        tr((char *)CONCAT17(bVar5,CONCAT16(in_stack_ffffffffffffff1e,
                                           CONCAT24(in_stack_ffffffffffffff1c,
                                                    in_stack_ffffffffffffff18))),(char *)this_00,
           in_stack_ffffffffffffff0c);
        QAbstractSocketPrivate::setError(this_00,in_stack_ffffffffffffff0c,(QString *)0x253694);
        QString::~QString((QString *)0x25369e);
        pQVar6->state = UnconnectedState;
        stateChanged((QAbstractSocket *)0x2536c2,in_stack_ffffffffffffff0c);
        QAbstractSocketPrivate::resetSocketLayer(this_00);
      }
      SVar3 = state((QAbstractSocket *)0x2536d6);
      if (SVar3 == ConnectedState) {
        if ((bVar1 & 1) != 0) {
          (**(code **)&(in_RDI->d).d[0x10].super_QArrayData)();
        }
        local_a9 = true;
      }
      else {
        local_a9 = false;
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_a9;
}

Assistant:

bool QAbstractSocket::waitForConnected(int msecs)
{
    Q_D(QAbstractSocket);
#if defined (QABSTRACTSOCKET_DEBUG)
    qDebug("QAbstractSocket::waitForConnected(%i)", msecs);
#endif

    if (state() == ConnectedState) {
#if defined (QABSTRACTSOCKET_DEBUG)
        qDebug("QAbstractSocket::waitForConnected(%i) already connected", msecs);
#endif
        return true;
    }

    bool wasPendingClose = d->pendingClose;
    d->pendingClose = false;
    QDeadlineTimer deadline{msecs};

    if (d->state == HostLookupState) {
#if defined (QABSTRACTSOCKET_DEBUG)
        qDebug("QAbstractSocket::waitForConnected(%i) doing host name lookup", msecs);
#endif
        QHostInfo::abortHostLookup(d->hostLookupId);
        d->hostLookupId = -1;
        QHostAddress temp;
        if (temp.setAddress(d->hostName)) {
            QHostInfo info;
            info.setAddresses(QList<QHostAddress>() << temp);
            d->_q_startConnecting(info);
        } else {
            d->_q_startConnecting(QHostInfo::fromName(d->hostName));
        }
    }
    if (state() == UnconnectedState)
        return false; // connect not im progress anymore!

    bool timedOut = true;
#if defined (QABSTRACTSOCKET_DEBUG)
    int attempt = 1;
#endif
    while (state() == ConnectingState && !deadline.hasExpired()) {
        QDeadlineTimer timer = deadline;
        if (!deadline.isForever() && deadline.remainingTimeAsDuration() > DefaultConnectTimeout)
            timer = QDeadlineTimer(DefaultConnectTimeout);
#if defined (QABSTRACTSOCKET_DEBUG)
        qDebug("QAbstractSocket::waitForConnected(%i) waiting %.2f secs for connection attempt #%i",
               msecs, timer.remainingTime() / 1000.0, attempt++);
#endif
        timedOut = false;

        if (d->socketEngine && d->socketEngine->waitForWrite(timer, &timedOut) && !timedOut) {
            d->_q_testConnection();
        } else {
            d->_q_connectToNextAddress();
        }
    }

    if ((timedOut && state() != ConnectedState) || state() == ConnectingState) {
        d->setError(SocketTimeoutError, tr("Socket operation timed out"));
        d->state = UnconnectedState;
        emit stateChanged(d->state);
        d->resetSocketLayer();
    }

#if defined (QABSTRACTSOCKET_DEBUG)
    qDebug("QAbstractSocket::waitForConnected(%i) == %s", msecs,
           state() == ConnectedState ? "true" : "false");
#endif
    if (state() != ConnectedState)
        return false;
    if (wasPendingClose)
        disconnectFromHost();
    return true;
}